

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall sf2cute::SoundFont::ClearInstruments(SoundFont *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  pointer psVar2;
  pointer psVar3;
  
  psVar2 = (this->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar1) {
    psVar2 = (this->instruments_).
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->instruments_).
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = psVar2;
    if (psVar1 != psVar2) {
      do {
        this_00 = (psVar3->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
      (this->instruments_).
      super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    }
    return;
  }
  do {
    ((psVar2->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    parent_file_ = (SoundFont *)0x0;
    psVar2 = psVar2 + 1;
  } while (psVar2 != psVar1);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::clear(&this->instruments_);
  return;
}

Assistant:

void SoundFont::ClearInstruments() noexcept {
  for (const auto & instrument : instruments_) {
    instrument->reset_parent_file();
  }
  instruments_.clear();
}